

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShardedSupermapBuilder.hpp
# Opt level: O0

unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
 supermap::ShardedSupermapBuilder<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>::
 build(size_t nShards,unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *hasher,
      unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
      *nested,BuildParameters *params)

{
  pointer pEVar1;
  path *this;
  size_type in_RCX;
  path *in_RSI;
  path *in_RDI;
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  *in_R8;
  size_t shard;
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
  storages;
  size_t i;
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  nestedStorages;
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffe48;
  path *in_stack_fffffffffffffe50;
  path *__u;
  allocator_type *in_stack_fffffffffffffe60;
  allocator_type *__a;
  size_type in_stack_fffffffffffffe68;
  _Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_*,_false>
  __lhs;
  path *this_00;
  undefined1 *__val;
  string local_168 [15];
  format in_stack_fffffffffffffea7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  path *in_stack_fffffffffffffeb0;
  undefined1 local_c0 [48];
  path *local_90;
  allocator_type local_81;
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
  local_80;
  undefined1 local_68 [8];
  path *local_60;
  undefined1 local_41 [17];
  BuildParameters *in_stack_ffffffffffffffd0;
  
  __val = local_41;
  __lhs._M_head_impl =
       (KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long> *)in_RDI;
  this_00 = in_RSI;
  std::
  allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>
  ::allocator((allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>
               *)0x1965ab);
  std::
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  ::vector((vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
            *)in_RDI,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::
  allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>
  ::~allocator((allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>
                *)0x1965d1);
  std::
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  ::operator[]((vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
                *)(local_41 + 1),0);
  std::
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  ::operator=((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
               *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  for (local_60 = (path *)0x1; local_60 < in_RSI;
      local_60 = (path *)&(local_60->_M_pathname).field_0x1) {
    std::
    vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
    ::operator[]((vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
                  *)(local_41 + 1),0);
    pEVar1 = std::
             unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
             ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                           *)0x196637);
    (**(pEVar1->
       super_AllowCreateLikeThis<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>
       )._vptr_AllowCreateLikeThis)
              (local_68,&pEVar1->
                         super_AllowCreateLikeThis<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>
              );
    std::
    vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
    ::operator[]((vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
                  *)(local_41 + 1),(size_type)local_60);
    std::
    unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
    ::operator=((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::
    unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
    ::~unique_ptr((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                   *)in_stack_fffffffffffffe50);
  }
  __a = &local_81;
  __u = in_RSI;
  std::
  allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>
  ::allocator((allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>
               *)0x1966fa);
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
  ::vector((vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
            *)in_RDI,in_RCX,__a);
  std::
  allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>
  ::~allocator((allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>
                *)0x196720);
  for (local_90 = (path *)0x0; local_90 < in_RSI;
      local_90 = (path *)&(local_90->_M_pathname).field_0x1) {
    this = (path *)std::
                   vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
                   ::operator[]((vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
                                 *)(local_41 + 1),(size_type)local_90);
    in_stack_fffffffffffffe50 = (path *)local_c0;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea7);
    std::__cxx11::to_string((unsigned_long)__val);
    std::filesystem::__cxx11::path::path
              (this_00,(string_type *)__lhs._M_head_impl,(format)((ulong)in_RDI >> 0x38));
    std::filesystem::__cxx11::operator/((path *)__lhs._M_head_impl,in_RDI);
    std::filesystem::__cxx11::path::operator_cast_to_string(this);
    local_c0._32_8_ =
         in_R8[6]._M_t.
         super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
         .
         super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_false>
         ._M_head_impl;
    DefaultSupermap<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>::build
              (in_R8,in_stack_ffffffffffffffd0);
    std::
    vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
    ::operator[](&local_80,(size_type)local_90);
    std::
    unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
    ::operator=((unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffe50,
                (unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
                 *)this);
    std::
    unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
    ::~unique_ptr((unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
                   *)in_stack_fffffffffffffe50);
    DefaultSupermap<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>::BuildParameters::
    ~BuildParameters((BuildParameters *)0x19687b);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe50);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_168);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe50);
  }
  std::
  make_unique<supermap::KeyHashingShardedKVS<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>,std::vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>,std::default_delete<supermap::KeyValueStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>>>,std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>,std::default_delete<supermap::KeyValueStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>>>>>,std::unique_ptr<supermap::Hasher,std::default_delete<supermap::Hasher>>>
            ((vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
              *)__lhs._M_head_impl,
             (unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)in_RDI);
  std::
  unique_ptr<supermap::KeyValueStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>,std::default_delete<supermap::KeyValueStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>>>
  ::
  unique_ptr<supermap::KeyHashingShardedKVS<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>,std::default_delete<supermap::KeyHashingShardedKVS<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long>>,void>
            ((unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
              *)__a,(unique_ptr<supermap::KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
                     *)__u);
  std::
  unique_ptr<supermap::KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<supermap::KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyHashingShardedKVS<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffe50);
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>_>_>
             *)__a);
  std::
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>_>_>
             *)__a);
  return (__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>,_true,_true>
          )(tuple<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long>_>_>
            )__lhs._M_head_impl;
}

Assistant:

static std::unique_ptr<KeyValueStorage<Key, Value, IndexT>> build(
        std::size_t nShards,
        std::unique_ptr<Hasher> &&hasher,
        std::unique_ptr<NestedKvs> &&nested,
        const BuildParameters &params
    ) {
        std::vector<std::unique_ptr<NestedKvs>> nestedStorages(nShards);
        nestedStorages[0] = std::move(nested);
        for (std::size_t i = 1; i < nShards; ++i) {
            nestedStorages[i] = nestedStorages[0]->createLikeThis();
        }
        std::vector<std::unique_ptr<KVS>> storages(nShards);
        for (std::size_t shard = 0; shard < nShards; ++shard) {
            storages[shard] = DefaultSupermap<Key, Value, IndexT>::build(
                std::move(nestedStorages[shard]),
                BuildParameters{
                    params.batchSize,
                    params.maxNotSortedPart,
                    std::filesystem::path(params.folderName) / std::to_string(shard),
                    params.errorProbability,
                }
            );
        }

        return std::make_unique<KeyHashingShardedKVS<Key, Value, IndexT>>(
            std::move(storages),
            std::move(hasher)
        );
    }